

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O2

string * __thiscall
toml::format<char_const*,char_const(&)[6],char_const*,char_const(&)[15]>
          (string *__return_storage_ptr__,toml *this,stringstream *ss,char **t,char (*args) [6],
          char **args_1,char (*args_2) [15])

{
  char (*args_1_00) [15];
  
  args_1_00 = (char (*) [15])args_1;
  std::operator<<((ostream *)(this + 0x10),*(char **)ss);
  format<char_const(&)[6],char_const*,char_const(&)[15]>
            (__return_storage_ptr__,this,(stringstream *)t,args,args_1,args_1_00);
  return __return_storage_ptr__;
}

Assistant:

std::string format(std::stringstream& ss, T&& t, Args&&... args)
{
    ss << std::forward<T>(t);
    return format(ss, std::forward<Args>(args)...);
}